

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Nodes_EmptyNodeType_Test::~Nodes_EmptyNodeType_Test
          (Nodes_EmptyNodeType_Test *this)

{
  Nodes_EmptyNodeType_Test *this_local;
  
  ~Nodes_EmptyNodeType_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Nodes, EmptyNodeType) {
  using node_type = StringTable::node_type;
  node_type n;
  EXPECT_FALSE(n);
  EXPECT_TRUE(n.empty());

  EXPECT_TRUE((std::is_same<node_type::allocator_type,
                            StringTable::allocator_type>::value));
}